

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::WriteXMLLabels(cmCTestCoverageHandler *this,cmXMLWriter *xml,string *source)

{
  bool bVar1;
  pointer ppVar2;
  reference value;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8;
  int *local_98;
  int *ls;
  iterator __end2;
  iterator __begin2;
  LabelSet *__range2;
  allocator<char> local_61;
  string local_60;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
  local_28;
  const_iterator li;
  string *source_local;
  cmXMLWriter *xml_local;
  cmCTestCoverageHandler *this_local;
  
  li._M_node = (_Base_ptr)source;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
       ::find(&this->SourceLabels,source);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
       ::end(&this->SourceLabels);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  bVar1 = std::operator!=(&local_28,&local_38);
  local_ba = 0;
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
             ::operator->(&local_28);
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                      (&(ppVar2->second).super_set<int,_std::less<int>,_std::allocator<int>_>);
    local_ba = bVar1 ^ 0xff;
  }
  if ((local_ba & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Labels",&local_61);
    cmXMLWriter::StartElement(xml,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
             ::operator->(&local_28);
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       (&(ppVar2->second).super_set<int,_std::less<int>,_std::allocator<int>_>);
    ls = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          (&(ppVar2->second).super_set<int,_std::less<int>,_std::allocator<int>_>);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&ls), bVar1) {
      local_98 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Label",&local_b9);
      value = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->Labels,(long)*local_98);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,value);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    cmXMLWriter::EndElement(xml);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::WriteXMLLabels(cmXMLWriter& xml,
                                            std::string const& source)
{
  LabelMapType::const_iterator li = this->SourceLabels.find(source);
  if (li != this->SourceLabels.end() && !li->second.empty()) {
    xml.StartElement("Labels");
    for (auto const& ls : li->second) {
      xml.Element("Label", this->Labels[ls]);
    }
    xml.EndElement(); // Labels
  }
}